

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformprintdevice.cpp
# Opt level: O3

InputSlot * __thiscall
QPlatformPrintDevice::defaultInputSlot(InputSlot *__return_storage_ptr__,QPlatformPrintDevice *this)

{
  long in_FS_OFFSET;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  qsizetype local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  __return_storage_ptr__->id = 0xaaaaaaaa;
  __return_storage_ptr__->windowsId = -0x55555556;
  (__return_storage_ptr__->key).d.d = (Data *)0x0;
  (__return_storage_ptr__->key).d.ptr = "Auto";
  (__return_storage_ptr__->key).d.size = 4;
  QCoreApplication::translate((char *)&local_38,"Print Device Input Slot","Automatic",0);
  *(undefined4 *)&(__return_storage_ptr__->name).d.d = local_38;
  *(undefined4 *)((long)&(__return_storage_ptr__->name).d.d + 4) = uStack_34;
  *(undefined4 *)&(__return_storage_ptr__->name).d.ptr = uStack_30;
  *(undefined4 *)((long)&(__return_storage_ptr__->name).d.ptr + 4) = uStack_2c;
  (__return_storage_ptr__->name).d.size = local_28;
  __return_storage_ptr__->id = Auto;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QPrint::InputSlot QPlatformPrintDevice::defaultInputSlot() const
{
    QPrint::InputSlot input;
    input.key = QByteArrayLiteral("Auto");
    input.name = QCoreApplication::translate("Print Device Input Slot", "Automatic");
    input.id = QPrint::Auto;
    return input;
}